

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmach.c
# Opt level: O0

double dmach(char *cmach)

{
  int iVar1;
  undefined2 in_FPUControlWord;
  byte bVar2;
  int local_2c;
  double dStack_28;
  int argument;
  double rmach;
  double small;
  double sfmin;
  char *cmach_local;
  
  bVar2 = (byte)((ushort)in_FPUControlWord >> 8);
  sfmin = (double)cmach;
  iVar1 = strncmp(cmach,"E",1);
  if (iVar1 == 0) {
    dStack_28 = 1.1102230246251565e-16;
  }
  else {
    iVar1 = strncmp((char *)sfmin,"S",1);
    if (iVar1 == 0) {
      dStack_28 = 2.2250738585072014e-308;
    }
    else {
      iVar1 = strncmp((char *)sfmin,"B",1);
      if (iVar1 == 0) {
        dStack_28 = 2.0;
      }
      else {
        iVar1 = strncmp((char *)sfmin,"P",1);
        if (iVar1 == 0) {
          dStack_28 = 2.220446049250313e-16;
        }
        else {
          iVar1 = strncmp((char *)sfmin,"N",1);
          if (iVar1 == 0) {
            dStack_28 = 53.0;
          }
          else {
            iVar1 = strncmp((char *)sfmin,"R",1);
            if (iVar1 == 0) {
              dStack_28 = (double)(0x2dU >> (bVar2 >> 1 & 6) & 3);
            }
            else {
              iVar1 = strncmp((char *)sfmin,"M",1);
              if (iVar1 == 0) {
                dStack_28 = -1021.0;
              }
              else {
                iVar1 = strncmp((char *)sfmin,"U",1);
                if (iVar1 == 0) {
                  dStack_28 = 2.2250738585072014e-308;
                }
                else {
                  iVar1 = strncmp((char *)sfmin,"L",1);
                  if (iVar1 == 0) {
                    dStack_28 = 1024.0;
                  }
                  else {
                    iVar1 = strncmp((char *)sfmin,"O",1);
                    if (iVar1 == 0) {
                      dStack_28 = 1.79769313486232e+308;
                    }
                    else {
                      local_2c = 0;
                      input_error("dmach",&local_2c);
                      dStack_28 = 0.0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return dStack_28;
}

Assistant:

double dmach(char *cmach)
{
/*  -- SuperLU auxiliary routine (version 5.0) --   
    This uses C99 standard constants, and is thread safe.

    Must be compiled with -std=c99 flag.


    Purpose   
    =======   

    DMACH returns double precision machine parameters.   

    Arguments   
    =========   

    CMACH   (input) CHARACTER*1   
            Specifies the value to be returned by DMACH:   
            = 'E' or 'e',   DMACH := eps   
            = 'S' or 's ,   DMACH := sfmin   
            = 'B' or 'b',   DMACH := base   
            = 'P' or 'p',   DMACH := eps*base   
            = 'N' or 'n',   DMACH := t   
            = 'R' or 'r',   DMACH := rnd   
            = 'M' or 'm',   DMACH := emin   
            = 'U' or 'u',   DMACH := rmin   
            = 'L' or 'l',   DMACH := emax   
            = 'O' or 'o',   DMACH := rmax   

            where   

            eps   = relative machine precision   
            sfmin = safe minimum, such that 1/sfmin does not overflow   
            base  = base of the machine   
            prec  = eps*base   
            t     = number of (base) digits in the mantissa   
            rnd   = 1.0 when rounding occurs in addition, 0.0 otherwise   
            emin  = minimum exponent before (gradual) underflow   
            rmin  = underflow threshold - base**(emin-1)   
            emax  = largest exponent before overflow   
            rmax  = overflow threshold  - (base**emax)*(1-eps)   

   ===================================================================== 
*/

    double sfmin, small, rmach;

    if (strncmp(cmach, "E", 1)==0) {
	rmach = DBL_EPSILON * 0.5;
    } else if (strncmp(cmach, "S", 1)==0) {
	sfmin = DBL_MIN;
	small = 1. / DBL_MAX;
	if (small >= sfmin) {
	    /* Use SMALL plus a bit, to avoid the possibility of rounding   
	       causing overflow when computing  1/sfmin. */
	    sfmin = small * (DBL_EPSILON*0.5 + 1.);
	}
	rmach = sfmin;
    } else if (strncmp(cmach, "B", 1)==0) {
	rmach = FLT_RADIX;
    } else if (strncmp(cmach, "P", 1)==0) {
	rmach = DBL_EPSILON * 0.5 * FLT_RADIX;
    } else if (strncmp(cmach, "N", 1)==0) {
	rmach = DBL_MANT_DIG;
    } else if (strncmp(cmach, "R", 1)==0) {
	rmach = FLT_ROUNDS;
    } else if (strncmp(cmach, "M", 1)==0) {
	rmach = DBL_MIN_EXP;
    } else if (strncmp(cmach, "U", 1)==0) {
	rmach = DBL_MIN;
    } else if (strncmp(cmach, "L", 1)==0) {
	rmach = DBL_MAX_EXP;
    } else if (strncmp(cmach, "O", 1)==0) {
	rmach = DBL_MAX;
    } else {
        int argument = 0;
        input_error("dmach", &argument);
        rmach = 0;
    }

    return rmach;

}